

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPathCommand.cxx
# Opt level: O0

string * __thiscall
cmFindPathCommand::FindHeader_abi_cxx11_(string *__return_storage_ptr__,cmFindPathCommand *this)

{
  ulong uVar1;
  string local_128;
  string local_108;
  string local_e8;
  undefined1 local_c5;
  string local_b8;
  undefined1 local_98 [8];
  cmFindBaseDebugState debug;
  cmFindPathCommand *this_local;
  string *header;
  
  debug.FoundSearchLocation.path.field_2._8_8_ = this;
  std::__cxx11::string::string
            ((string *)&local_b8,(string *)&(this->super_cmFindBase).FindCommandName);
  cmFindBaseDebugState::cmFindBaseDebugState
            ((cmFindBaseDebugState *)local_98,&local_b8,&this->super_cmFindBase);
  std::__cxx11::string::~string((string *)&local_b8);
  local_c5 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if ((((this->super_cmFindBase).super_cmFindCommon.SearchFrameworkFirst & 1U) != 0) ||
     (((this->super_cmFindBase).super_cmFindCommon.SearchFrameworkOnly & 1U) != 0)) {
    FindFrameworkHeader_abi_cxx11_(&local_e8,this,(cmFindBaseDebugState *)local_98);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  uVar1 = std::__cxx11::string::empty();
  if (((uVar1 & 1) != 0) &&
     (((this->super_cmFindBase).super_cmFindCommon.SearchFrameworkOnly & 1U) == 0)) {
    FindNormalHeader_abi_cxx11_(&local_108,this,(cmFindBaseDebugState *)local_98);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
  }
  uVar1 = std::__cxx11::string::empty();
  if (((uVar1 & 1) != 0) &&
     (((this->super_cmFindBase).super_cmFindCommon.SearchFrameworkLast & 1U) != 0)) {
    FindFrameworkHeader_abi_cxx11_(&local_128,this,(cmFindBaseDebugState *)local_98);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_128);
    std::__cxx11::string::~string((string *)&local_128);
  }
  local_c5 = 1;
  cmFindBaseDebugState::~cmFindBaseDebugState((cmFindBaseDebugState *)local_98);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindPathCommand::FindHeader()
{
  cmFindBaseDebugState debug(this->FindCommandName, this);
  std::string header;
  if (this->SearchFrameworkFirst || this->SearchFrameworkOnly) {
    header = this->FindFrameworkHeader(debug);
  }
  if (header.empty() && !this->SearchFrameworkOnly) {
    header = this->FindNormalHeader(debug);
  }
  if (header.empty() && this->SearchFrameworkLast) {
    header = this->FindFrameworkHeader(debug);
  }

  return header;
}